

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

_Bool char1(Env *env,int32_t c)

{
  _Bool _Var1;
  int32_t c_local;
  Env *env_local;
  
  _Var1 = char_at(env,1,c);
  return _Var1;
}

Assistant:

static bool char1(Env *env, int32_t c) {
  return char_at(env, 1, c);
}